

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O2

token * __thiscall mjs::token::operator=(token *this,token *t)

{
  token_type tVar1;
  
  if (this != t) {
    destroy(this);
    tVar1 = t->type_;
    this->type_ = tVar1;
    if ((tVar1 == string_literal) || (tVar1 == identifier)) {
      std::__cxx11::wstring::wstring
                ((wstring *)&(this->field_1).text_,(wstring *)&(t->field_1).text_);
    }
    else {
      (this->field_1).ivalue_ = (t->field_1).ivalue_;
    }
  }
  return this;
}

Assistant:

token& operator=(const token& t) {
        if (this != &t) {
            destroy();
            type_ = t.type_;
            if (t.has_text()) {
                new (&text_) std::wstring(t.text_);
            } else {
                ivalue_ = t.ivalue_;
            }
        }
        return *this;
    }